

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

int __thiscall HashTable::Search(HashTable *this,Game *game)

{
  Game *pGVar1;
  bool *pbVar2;
  Game *pGVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int k;
  int iVar10;
  ulong uVar11;
  
  iVar8 = game->id;
  iVar10 = this->hashSize;
  uVar11 = (long)iVar8 % (long)iVar10;
  pbVar2 = this->arrAddress;
  if ((pbVar2[uVar11] == true) && (pbVar2[uVar11] == true)) {
    do {
      uVar6 = (long)(int)((int)uVar11 +
                         (uint)(0x55555554 < iVar10 * -0x55555555 + 0x2aaaaaaaU) * 2 + 1) %
              (long)iVar10;
      uVar11 = uVar6 & 0xffffffff;
    } while (pbVar2[(int)uVar6] != false);
  }
  pGVar3 = this->games;
  iVar9 = (int)uVar11;
  if (pGVar3[iVar9].id == iVar8) {
    pGVar1 = pGVar3 + iVar9;
    sVar4 = (pGVar1->manufacturer)._M_string_length;
    sVar5 = (game->manufacturer)._M_string_length;
    if (((sVar4 == sVar5) &&
        (((((sVar4 == 0 ||
            (iVar7 = bcmp((pGVar1->manufacturer)._M_dataplus._M_p,
                          (game->manufacturer)._M_dataplus._M_p,sVar4), iVar7 == 0)) &&
           (sVar4 = pGVar3[iVar9].date._M_string_length, sVar4 == (game->date)._M_string_length)) &&
          ((sVar4 == 0 ||
           (iVar7 = bcmp(pGVar3[iVar9].date._M_dataplus._M_p,(game->date)._M_dataplus._M_p,sVar4),
           iVar7 == 0)))) &&
         (sVar4 = pGVar3[iVar9].genre._M_string_length, sVar4 == (game->genre)._M_string_length))))
       && (((sVar4 == 0 ||
            (iVar7 = bcmp(pGVar3[iVar9].genre._M_dataplus._M_p,(game->genre)._M_dataplus._M_p,sVar4)
            , iVar7 == 0)) &&
           (sVar4 = (pGVar1->name)._M_string_length, sVar4 == (game->name)._M_string_length)))) {
      if (sVar4 == 0) {
        return iVar9;
      }
      iVar7 = bcmp((pGVar1->name)._M_dataplus._M_p,(game->name)._M_dataplus._M_p,sVar4);
      if (iVar7 == 0) {
        return iVar9;
      }
    }
    iVar10 = (int)(iVar8 + (uint)(0x55555554 < iVar10 * -0x55555555 + 0x2aaaaaaaU) * 2 + 1) % iVar10
    ;
    game->id = iVar10;
    sVar4 = pGVar3[iVar10].manufacturer._M_string_length;
    if (((((sVar4 == sVar5) &&
          (((sVar4 == 0 ||
            (iVar8 = bcmp(pGVar3[iVar10].manufacturer._M_dataplus._M_p,
                          (game->manufacturer)._M_dataplus._M_p,sVar4), iVar8 == 0)) &&
           (sVar4 = pGVar3[iVar10].date._M_string_length, sVar4 == (game->date)._M_string_length))))
         && ((sVar4 == 0 ||
             (iVar8 = bcmp(pGVar3[iVar10].date._M_dataplus._M_p,(game->date)._M_dataplus._M_p,sVar4)
             , iVar8 == 0)))) &&
        ((sVar4 = pGVar3[iVar10].genre._M_string_length, sVar4 == (game->genre)._M_string_length &&
         ((sVar4 == 0 ||
          (iVar8 = bcmp(pGVar3[iVar10].genre._M_dataplus._M_p,(game->genre)._M_dataplus._M_p,sVar4),
          iVar8 == 0)))))) &&
       (sVar4 = pGVar3[iVar10].name._M_string_length, sVar4 == (game->name)._M_string_length)) {
      if (sVar4 == 0) {
        return iVar10;
      }
      iVar8 = bcmp(pGVar3[iVar10].name._M_dataplus._M_p,(game->name)._M_dataplus._M_p,sVar4);
      if (iVar8 == 0) {
        return iVar10;
      }
    }
    iVar8 = 0;
    do {
      do {
        iVar10 = (int)(game->id +
                       (uint)(0x55555554 < this->hashSize * -0x55555555 + 0x2aaaaaaaU) * 2 + 1) %
                 this->hashSize;
        game->id = iVar10;
      } while (pbVar2[iVar10] != false);
      sVar4 = pGVar3[iVar10].manufacturer._M_string_length;
      if ((((sVar4 == sVar5) &&
           (((sVar4 == 0 ||
             (iVar9 = bcmp(pGVar3[iVar10].manufacturer._M_dataplus._M_p,
                           (game->manufacturer)._M_dataplus._M_p,sVar4), iVar9 == 0)) &&
            (sVar4 = pGVar3[iVar10].date._M_string_length, sVar4 == (game->date)._M_string_length)))
           ) && ((((sVar4 == 0 ||
                   (iVar9 = bcmp(pGVar3[iVar10].date._M_dataplus._M_p,(game->date)._M_dataplus._M_p,
                                 sVar4), iVar9 == 0)) &&
                  (sVar4 = pGVar3[iVar10].genre._M_string_length,
                  sVar4 == (game->genre)._M_string_length)) &&
                 ((sVar4 == 0 ||
                  (iVar9 = bcmp(pGVar3[iVar10].genre._M_dataplus._M_p,(game->genre)._M_dataplus._M_p
                                ,sVar4), iVar9 == 0)))))) &&
         (sVar4 = pGVar3[iVar10].name._M_string_length, sVar4 == (game->name)._M_string_length)) {
        if (sVar4 == 0) {
          return iVar10;
        }
        iVar9 = bcmp(pGVar3[iVar10].name._M_dataplus._M_p,(game->name)._M_dataplus._M_p,sVar4);
        if (iVar9 == 0) {
          return iVar10;
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != this->hashSize);
  }
  return -1;
}

Assistant:

int Search(Game game)
        {

            int index = key_hash_func(game.id, hashSize);
            if (arrAddress[index])
            {
                while (arrAddress[index])
                {
                    index = value_hash_func(index, hashSize);
                }
            }
                if (games[index].id == game.id)
                {
                    if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                    {
                        return index;
                    }
                    else
                    {
                        index = value_hash_func(game.id, hashSize);
                        if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                        {
                            return index;
                        }
                        int count = 0;
                        while (true)
                        {

                            index = value_hash_func(game.id, hashSize);
                            if (arrAddress[index])
                            {
                                continue;
                            }
                            else
                            {
                                count++;
                                if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                                {
                                    return index;
                                }
                            }
                            if (count == hashSize)
                            {
                                break;
                            }
                        }

                    }
                }

            return -1;
        }